

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashing.h
# Opt level: O2

uint64_t llvm::hashing::detail::hash_17to32_bytes(char *s,size_t len,uint64_t seed)

{
  uint64_t uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = *(long *)s * -0x4b6d499041670d8d - *(ulong *)(s + 8);
  uVar2 = *(ulong *)(s + 8) ^ 0xc949d7c7509e6557;
  uVar3 = *(long *)(s + (len - 8)) * -0x651e95c4d06fbfb1 ^ seed;
  uVar1 = hash_16_bytes((uVar3 << 0x22 | uVar3 >> 0x1e) +
                        (uVar4 * 0x200000 | uVar4 >> 0x2b) +
                        *(long *)(s + (len - 0x10)) * -0x3c5a37a36834ced9,
                        len + seed + *(long *)s * -0x4b6d499041670d8d +
                        (uVar2 << 0x2c | uVar2 >> 0x14) +
                        *(long *)(s + (len - 8)) * 0x651e95c4d06fbfb1);
  return uVar1;
}

Assistant:

inline uint64_t hash_17to32_bytes(const char *s, size_t len, uint64_t seed) {
  uint64_t a = fetch64(s) * k1;
  uint64_t b = fetch64(s + 8);
  uint64_t c = fetch64(s + len - 8) * k2;
  uint64_t d = fetch64(s + len - 16) * k0;
  return hash_16_bytes(rotate(a - b, 43) + rotate(c ^ seed, 30) + d,
                       a + rotate(b ^ k3, 20) - c + len + seed);
}